

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::_first_real_span_dec(basic_substring<const_char> *this,size_t pos)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  char *s_;
  ulong len_;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  basic_substring<const_char> bVar8;
  basic_substring<const_char> local_10;
  
  s_ = this->str;
  uVar2 = this->len;
  bVar7 = false;
  for (; pos < uVar2; pos = pos + 1) {
    bVar1 = s_[pos];
    if (9 < (byte)(bVar1 - 0x30)) {
      if (bVar1 == 0x2e) {
        bVar4 = false;
        goto LAB_00193012;
      }
      if ((bVar1 & 0xdf) == 0x45) {
        bVar3 = false;
        goto LAB_00193093;
      }
      uVar5 = (uint)bVar1;
      if (((((0x3b < uVar5) || ((0x800120100002601U >> ((ulong)uVar5 & 0x3f) & 1) == 0)) &&
           (uVar5 != 0x5d)) && (uVar5 != 0x7d)) || (!bVar7)) goto LAB_0019317f;
      basic_substring(&local_10,s_,pos);
      s_ = local_10.str;
      uVar6 = local_10.len;
      goto LAB_00193002;
    }
    bVar7 = true;
  }
  uVar6 = 0;
LAB_00192ffa:
  if (bVar7) {
    uVar6 = uVar2;
  }
  goto LAB_00193002;
  while( true ) {
    bVar1 = s_[pos];
    bVar4 = true;
    if (9 < (byte)(bVar1 - 0x30)) break;
LAB_00193012:
    bVar3 = bVar4;
    pos = pos + 1;
    if (uVar2 <= pos) {
      uVar6 = 0;
      if (bVar3) {
        uVar6 = uVar2;
      }
      goto LAB_00192ffa;
    }
  }
  if ((bVar1 & 0xdf) == 0x45) {
LAB_00193093:
    s_ = this->str;
    uVar6 = 0;
    if (((bool)(bVar7 | bVar3)) && (len_ = pos + 2, len_ < uVar2)) {
      bVar7 = false;
      for (; uVar6 = uVar2, len_ < uVar2; len_ = len_ + 1) {
        bVar1 = s_[len_];
        if (9 < (byte)(bVar1 - 0x30)) {
          if ((!bVar7) ||
             (((0x3b < bVar1 || ((0x800120100002601U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) &&
              ((bVar1 != 0x5d && (bVar1 != 0x7d)))))) goto LAB_0019317f;
          basic_substring(&local_10,s_,len_);
          s_ = local_10.str;
          uVar6 = local_10.len;
          break;
        }
        bVar7 = true;
      }
    }
  }
  else {
    uVar5 = (uint)bVar1;
    if (((((bVar1 < 0x3c) && ((0x800120100002601U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) ||
         (uVar5 == 0x5d)) || (uVar5 == 0x7d)) && (bVar7 || bVar3)) {
      basic_substring(&local_10,s_,pos);
      s_ = local_10.str;
      uVar6 = local_10.len;
    }
    else {
LAB_0019317f:
      uVar6 = 0;
    }
  }
LAB_00193002:
  bVar8.len = uVar6;
  bVar8.str = s_;
  return bVar8;
}

Assistant:

C4_NO_INLINE C4_PURE basic_substring _first_real_span_dec(size_t pos) const noexcept
    {
        bool intchars = false;
        bool fracchars = false;
        bool powchars;
        // integral part
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(c >= '0' && c <= '9')
            {
                intchars = true;
            }
            else if(c == '.')
            {
                ++pos;
                goto fractional_part_dec;
            }
            else if(c == 'e' || c == 'E')
            {
                ++pos;
                goto power_part_dec;
            }
            else if(_is_delim_char(c))
            {
                return intchars ? first(pos) : first(0);
            }
            else
            {
                return first(0);
            }
        }
        // no . or p were found; this is either an integral number
        // or not a number at all
        return intchars ?
            *this :
            first(0);
    fractional_part_dec:
        C4_ASSERT(pos > 0);
        C4_ASSERT(str[pos - 1] == '.');
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(c >= '0' && c <= '9')
            {
                fracchars = true;
            }
            else if(c == 'e' || c == 'E')
            {
                ++pos;
                goto power_part_dec;
            }
            else if(_is_delim_char(c))
            {
                return intchars || fracchars ? first(pos) : first(0);
            }
            else
            {
                return first(0);
            }
        }
        return intchars || fracchars ?
            *this :
            first(0);
    power_part_dec:
        C4_ASSERT(pos > 0);
        C4_ASSERT(str[pos - 1] == 'e' || str[pos - 1] == 'E');
        // either a + or a - is expected here, followed by more chars.
        // also, using (pos+1) in this check will cause an early
        // return when no more chars follow the sign.
        if(len <= (pos+1) || ((!intchars) && (!fracchars)))
            return first(0);
        ++pos; // this was the sign.
        // ... so the (pos+1) ensures that we enter the loop and
        // hence that there exist chars in the power part
        powchars = false;
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(c >= '0' && c <= '9')
                powchars = true;
            else if(powchars && _is_delim_char(c))
                return first(pos);
            else
                return first(0);
        }
        return *this;
    }